

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  string *extraout_RAX;
  string *psVar4;
  string *psVar5;
  char *__s;
  string basename;
  undefined7 *local_68;
  string *local_60;
  undefined7 local_58;
  undefined4 uStack_51;
  undefined1 local_4d;
  string local_48;
  
  local_58 = 0x646f746f72702e;
  uStack_51 = 0x6c657665;
  local_60 = (string *)0xb;
  local_4d = 0;
  if (filename->_M_string_length < 0xb) {
    __s = ".proto";
  }
  else {
    local_68 = &local_58;
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,filename->_M_string_length - 0xb,(string *)0xb);
    __s = ".proto";
    if (iVar2 == 0) {
      __s = ".protodevel";
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT17((undefined1)uStack_51,local_58) + 1);
    }
  }
  local_68 = &local_58;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar3);
  psVar5 = (string *)filename->_M_string_length;
  if (local_60 <= psVar5) {
    iVar2 = std::__cxx11::string::compare((ulong)filename,(long)psVar5 - (long)local_60,local_60);
    psVar5 = (string *)filename->_M_string_length;
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
      goto LAB_0023ef55;
    }
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar1,psVar5 + (long)pcVar1);
LAB_0023ef55:
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT17((undefined1)uStack_51,local_58) + 1);
  }
  ReplaceCharacters(&local_48,"-",'_');
  ReplaceCharacters(&local_48,"/",'.');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar4 = (string *)&local_48.field_2;
  if ((string *)local_48._M_dataplus._M_p != psVar4) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

string ModuleName(const string& filename) {
  string basename = StripProto(filename);
  ReplaceCharacters(&basename, "-", '_');
  ReplaceCharacters(&basename, "/", '.');
  return basename + "_pb2";
}